

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
booster::locale::basic_format<wchar_t>::write
          (basic_format<wchar_t> *this,int __fd,void *__buf,size_t __n)

{
  size_type *psVar1;
  int id;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  stream_type *out;
  string_type local_70;
  undefined1 local_50 [8];
  string_type format;
  
  out = (stream_type *)CONCAT44(in_register_00000034,__fd);
  psVar1 = &format._M_string_length;
  format._M_dataplus._M_p = (pointer)0x0;
  format._M_string_length._0_4_ = 0;
  local_50 = (undefined1  [8])psVar1;
  if (this->translate_ == true) {
    std::locale::locale((locale *)((long)&format.field_2 + 8),
                        (locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
    booster::locale::ios_info::get((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
    id = booster::locale::ios_info::domain_id();
    basic_message<wchar_t>::str_abi_cxx11_
              (&local_70,&this->message_,(locale *)((long)&format.field_2 + 8),id);
    std::__cxx11::wstring::operator=((wstring *)local_50,(wstring *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    std::locale::~locale((locale *)((long)&format.field_2 + 8));
  }
  else {
    std::__cxx11::wstring::_M_assign((wstring *)local_50);
  }
  format_output(this,out,(string_type *)local_50);
  sVar2 = extraout_RAX;
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50);
    sVar2 = extraout_RAX_00;
  }
  return sVar2;
}

Assistant:

void write(stream_type &out) const
            {
                string_type format;
                if(translate_)
                    format = message_.str(out.getloc(),ios_info::get(out).domain_id());
                else
                    format = format_;
               
                format_output(out,format);

            }